

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O0

void stackjit::Amd64Backend::moveMemoryRegWithCharOffsetToReg
               (CodeGen *codeGen,Registers dest,Registers srcMemReg,char offset)

{
  value_type_conflict1 local_1c [2];
  byte local_1a;
  value_type_conflict1 local_19 [3];
  Registers local_16;
  value_type_conflict1 local_15 [3];
  Registers local_12;
  Registers local_11;
  char offset_local;
  Registers srcMemReg_local;
  CodeGen *pCStack_10;
  Registers dest_local;
  CodeGen *codeGen_local;
  
  local_15[2] = offset;
  local_12 = srcMemReg;
  local_11 = dest;
  pCStack_10 = codeGen;
  if (srcMemReg == SP) {
    local_19[1] = 0x48;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(codeGen,local_19 + 1);
    local_19[0] = 0x8b;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pCStack_10,local_19);
    local_1a = local_11 << 3 | 0x44;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pCStack_10,&local_1a);
    local_1c[1] = 0x24;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pCStack_10,local_1c + 1);
    local_1c[0] = local_15[2];
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pCStack_10,local_1c);
  }
  else {
    local_15[1] = 0x48;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(codeGen,local_15 + 1);
    local_15[0] = 0x8b;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pCStack_10,local_15);
    local_16 = local_12 | 0x40 | local_11 << 3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pCStack_10,&local_16);
    local_19[2] = local_15[2];
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pCStack_10,local_19 + 2);
  }
  return;
}

Assistant:

void Amd64Backend::moveMemoryRegWithCharOffsetToReg(CodeGen& codeGen, Registers dest, Registers srcMemReg, char offset) {
		if (srcMemReg != Registers::SP) {
			codeGen.push_back(0x48);
			codeGen.push_back(0x8b);
			codeGen.push_back(0x40 | (Byte)srcMemReg | ((Byte)dest << 3));
			codeGen.push_back(offset);
		} else {
			codeGen.push_back(0x48);
			codeGen.push_back(0x8B);
			codeGen.push_back(0x44 | ((Byte)dest << 3));
			codeGen.push_back(0x24);
			codeGen.push_back(offset);
		}
	}